

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O1

string * __thiscall
duckdb::QueryProfiler::RenderDisabledMessage_abi_cxx11_
          (string *__return_storage_ptr__,QueryProfiler *this,ProfilerPrintFormat format)

{
  yyjson_val_pool *pool;
  bool bVar1;
  yyjson_mut_doc *this_00;
  InternalException *this_01;
  uint *object;
  undefined7 in_register_00000011;
  char *pcVar2;
  ulong uVar3;
  char *pcVar4;
  yyjson_mut_doc *doc;
  string local_68;
  string local_48;
  
  uVar3 = CONCAT71(in_register_00000011,format) & 0xffffffff;
  object = &switchD_004e5f48::switchdataD_013725e0;
  switch(uVar3) {
  case 0:
  case 2:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "Query profiling is disabled. Use \'PRAGMA enable_profiling;\' to enable profiling!";
    pcVar2 = "";
    break;
  case 1:
    doc = (yyjson_mut_doc *)0x0;
    this_00 = duckdb_yyjson::yyjson_mut_doc_new((yyjson_alc *)0x0);
    if (this_00 != (yyjson_mut_doc *)0x0) {
      pool = &this_00->val_pool;
      if (((this_00->val_pool).end != (this_00->val_pool).cur) ||
         (bVar1 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pool,&this_00->alc,1), bVar1)) {
        doc = (yyjson_mut_doc *)pool->cur;
        pool->cur = (yyjson_mut_val *)((yyjson_val_uni *)&doc->alc + 2);
      }
      else {
        doc = (yyjson_mut_doc *)0x0;
      }
      if (doc == (yyjson_mut_doc *)0x0) {
        doc = (yyjson_mut_doc *)0x0;
      }
      else {
        doc->root = (yyjson_mut_val *)0x7;
      }
    }
    if (((this_00 != (yyjson_mut_doc *)0x0) &&
        (this_00->root = (yyjson_mut_val *)doc, doc != (yyjson_mut_doc *)0x0)) &&
       ((~*(uint *)&doc->root & 7) == 0)) {
      RenderDisabledMessage_abi_cxx11_();
    }
    StringifyAndFree_abi_cxx11_
              (__return_storage_ptr__,(duckdb *)this_00,doc,(yyjson_mut_val *)object);
    return __return_storage_ptr__;
  case 3:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = anon_var_dwarf_643533f + 9;
    pcVar4 = anon_var_dwarf_643533f + 9;
    break;
  case 4:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = 
    "\n\t\t\t\t<!DOCTYPE html>\n                <html lang=\"en\"><head/><body>\n                  Query profiling is disabled. Use \'PRAGMA enable_profiling;\' to enable profiling!\n                </body></html>\n\t\t\t"
    ;
    pcVar2 = "";
    break;
  case 5:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = 
    "\n\t\t\t\tdigraph G {\n\t\t\t\t    node [shape=box, style=rounded, fontname=\"Courier New\", fontsize=10];\n\t\t\t\t    node_0_0 [label=\"Query profiling is disabled. Use \'PRAGMA enable_profiling;\' to enable profiling!\"];\n\t\t\t\t}\n\t\t\t"
    ;
    pcVar2 = "";
    break;
  default:
    this_01 = (InternalException *)__cxa_allocate_exception(0x10);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"Unknown ProfilerPrintFormat \"%s\"","");
    EnumUtil::ToString<duckdb::ProfilerPrintFormat>(&local_48,(ProfilerPrintFormat)uVar3);
    InternalException::InternalException<std::__cxx11::string>(this_01,&local_68,&local_48);
    __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar4,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

string QueryProfiler::RenderDisabledMessage(ProfilerPrintFormat format) const {
	switch (format) {
	case ProfilerPrintFormat::NO_OUTPUT:
		return "";
	case ProfilerPrintFormat::QUERY_TREE:
	case ProfilerPrintFormat::QUERY_TREE_OPTIMIZER:
		return "Query profiling is disabled. Use 'PRAGMA enable_profiling;' to enable profiling!";
	case ProfilerPrintFormat::HTML:
		return R"(
				<!DOCTYPE html>
                <html lang="en"><head/><body>
                  Query profiling is disabled. Use 'PRAGMA enable_profiling;' to enable profiling!
                </body></html>
			)";
	case ProfilerPrintFormat::GRAPHVIZ:
		return R"(
				digraph G {
				    node [shape=box, style=rounded, fontname="Courier New", fontsize=10];
				    node_0_0 [label="Query profiling is disabled. Use 'PRAGMA enable_profiling;' to enable profiling!"];
				}
			)";
	case ProfilerPrintFormat::JSON: {
		auto doc = yyjson_mut_doc_new(nullptr);
		auto result_obj = yyjson_mut_obj(doc);
		yyjson_mut_doc_set_root(doc, result_obj);

		yyjson_mut_obj_add_str(doc, result_obj, "result", "disabled");
		return StringifyAndFree(doc, result_obj);
	}
	default:
		throw InternalException("Unknown ProfilerPrintFormat \"%s\"", EnumUtil::ToString(format));
	}
}